

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

Optimizer * __thiscall CoreML::Specification::Optimizer::New(Optimizer *this,Arena *arena)

{
  Optimizer *this_00;
  
  this_00 = (Optimizer *)operator_new(0x20);
  Optimizer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Optimizer>(arena,this_00);
  }
  return this_00;
}

Assistant:

Optimizer* Optimizer::New(::google::protobuf::Arena* arena) const {
  Optimizer* n = new Optimizer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}